

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O2

size_t pstore::command_line::details::get_max_width(void)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  winsize w;
  
  w.ws_row = 0;
  w.ws_col = 0;
  w.ws_xpixel = 0;
  w.ws_ypixel = 0;
  iVar1 = ioctl(1,0x5413,&w);
  uVar2 = (uint)w.ws_col;
  if (iVar1 == -1) {
    uVar2 = 0;
  }
  uVar4 = 0x50;
  if (uVar2 != 0) {
    uVar4 = uVar2;
  }
  sVar3 = 0x28;
  if (0x13 < uVar4) {
    sVar3 = (size_t)uVar4;
  }
  return sVar3;
}

Assistant:

std::size_t get_max_width () {
                    std::size_t max_width = terminal_width ();
                    if (max_width == 0U) {
                        // We couldn't figure out the terminal width, so just guess at 80.
                        max_width = 80U;
                    }
                    if (max_width < overlong_opt_max) {
                        max_width = overlong_opt_max * 2U;
                    }
                    return max_width;
                }